

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_double>::operator==(ArrayPtr<const_double> *this,ArrayPtr<const_double> *other)

{
  double *pdVar1;
  double *pdVar2;
  size_t sVar3;
  bool bVar4;
  
  if (this->size_ != other->size_) {
    return false;
  }
  sVar3 = 0;
  while( true ) {
    bVar4 = this->size_ == sVar3;
    if (bVar4) {
      return bVar4;
    }
    pdVar1 = this->ptr + sVar3;
    pdVar2 = other->ptr + sVar3;
    sVar3 = sVar3 + 1;
    if (*pdVar1 != *pdVar2) break;
    if (NAN(*pdVar1) || NAN(*pdVar2)) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
    if (isIntegral<RemoveConst<T>>()) {
      if (size_ == 0) return true;
      return __builtin_memcmp(ptr, other.ptr, size_ * sizeof(T)) == 0;
    }
#endif
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }